

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_make_directory(char *tail)

{
  WRAP_CHAR *__ptr;
  WRAP_CHAR *abs_path;
  WRAP_CHAR *in_stack_00000008;
  _Bool ret;
  uint7 in_stack_fffffffffffffff0;
  byte bVar1;
  
  bVar1 = 0;
  __ptr = make_absolute_path((char *)(ulong)in_stack_fffffffffffffff0);
  if (__ptr != (WRAP_CHAR *)0x0) {
    bVar1 = do_make_directory(in_stack_00000008);
    free(__ptr);
  }
  return (_Bool)(bVar1 & 1);
}

Assistant:

static bool fs_stdio_make_directory(const char *tail)
{
   bool ret = false;
   WRAP_CHAR *abs_path = make_absolute_path(tail);
   if (abs_path) {
      ret = do_make_directory(abs_path);
      free(abs_path);
   }
   return ret;
}